

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashlist.c
# Opt level: O3

ktx_error_code_e ktxHashList_FindValue(ktxHashList *pHead,char *key,uint *pValueLen,void **ppValue)

{
  uint uVar1;
  ktx_error_code_e kVar2;
  ktxHashListEntry *in_RAX;
  void *pvVar3;
  ktxHashListEntry *pEntry;
  ktxHashListEntry *local_18;
  
  kVar2 = KTX_INVALID_VALUE;
  if (ppValue != (void **)0x0 && pValueLen != (uint *)0x0) {
    local_18 = in_RAX;
    kVar2 = ktxHashList_FindEntry(pHead,key,&local_18);
    if (kVar2 == KTX_SUCCESS) {
      uVar1 = local_18->valueLen;
      *pValueLen = uVar1;
      if (uVar1 == 0) {
        pvVar3 = (void *)0x0;
      }
      else {
        pvVar3 = local_18->value;
      }
      *ppValue = pvVar3;
    }
  }
  return kVar2;
}

Assistant:

KTX_error_code
ktxHashList_FindValue(ktxHashList *pHead, const char* key, unsigned int* pValueLen, void** ppValue)
{
    if (pValueLen && ppValue) {
        ktxHashListEntry* pEntry;
        KTX_error_code result;

        result = ktxHashList_FindEntry(pHead, key, &pEntry);
        if (result == KTX_SUCCESS) {
            ktxHashListEntry_GetValue(pEntry, pValueLen, ppValue);
            return KTX_SUCCESS;
        } else
            return result;
    } else
        return KTX_INVALID_VALUE;
}